

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
* fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::basic_string_view<char,std::char_traits<char>>,unsigned_long>
            (basic_string_view<char,_std::char_traits<char>_> *args,unsigned_long *args_1)

{
  longlong lVar1;
  std_string_view<char> s;
  size_t sVar2;
  longlong *in_RDX;
  undefined8 *in_RSI;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  *in_RDI;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  *pfVar3;
  size_t local_c0;
  undefined1 local_a9;
  char *local_a8;
  size_t local_a0;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  char *local_88 [3];
  char **local_70;
  basic_string_view<char> local_68 [3];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 *local_18;
  basic_string_view<char> local_10;
  
  local_91 = 1;
  local_92 = 1;
  local_93 = 1;
  local_18 = &local_a9;
  local_38 = *in_RSI;
  uStack_30 = in_RSI[1];
  s._M_str = (char *)in_RDI;
  s._M_len = (size_t)in_RDI;
  pfVar3 = in_RDI;
  local_10 = detail::to_string_view<char,_0>(s);
  local_a8 = local_10.data_;
  local_a0 = local_10.size_;
  local_68[0].data_ = local_10.data_;
  local_68[0].size_ = local_10.size_;
  local_70 = local_88;
  local_88[0] = basic_string_view<char>::data(local_68);
  sVar2 = basic_string_view<char>::size(local_68);
  lVar1 = *in_RDX;
  (in_RDI->data_).args_[0].field_0.string.data = local_88[0];
  (in_RDI->data_).args_[0].field_0.string.size = sVar2;
  (in_RDI->data_).args_[1].field_0.long_long_value = lVar1;
  (in_RDI->data_).args_[1].field_0.string.size = local_c0;
  return pfVar3;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}